

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O3

int jpc_ns_analyze(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  jpc_fix_t *pjVar1;
  undefined1 auVar2 [16];
  jpc_fix_t *pjVar3;
  jpc_fix_t *pjVar4;
  ulong uVar5;
  jpc_fix_t *pjVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long *plVar13;
  uint uVar14;
  int iVar15;
  jpc_fix_t *pjVar16;
  jpc_fix_t *pjVar17;
  long *plVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint n_3;
  int iVar24;
  jpc_fix_t *pjVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint llen;
  jpc_fix_t *local_90;
  uint local_80;
  jpc_fix_t *local_78;
  
  uVar23 = ystart & 1;
  uVar8 = width & 0xfffffff0;
  local_80 = ystart & 1;
  pjVar25 = a;
  if (uVar8 != 0) {
    uVar9 = (height - uVar23) + 1;
    uVar14 = uVar9 >> 1;
    uVar5 = (ulong)(uVar14 * stride);
    iVar10 = height - uVar14;
    uVar19 = height & 1;
    iVar24 = (iVar10 - uVar23) - (uint)(uVar19 == uVar23);
    iVar15 = (uVar14 - (uVar23 == 0)) - (uint)(uVar19 != uVar23);
    pjVar16 = a + uVar5;
    local_90 = a + (uint)stride;
    local_78 = a + (uint)stride + uVar5;
    uVar23 = 0;
    do {
      jpc_qmfb_split_colgrp(pjVar25,height,stride,ystart & 1);
      if (1 < (uint)height) {
        pjVar3 = pjVar25 + uVar5;
        iVar21 = iVar24;
        pjVar6 = pjVar3;
        pjVar4 = pjVar25;
        pjVar17 = local_90;
        if (local_80 != 0) {
          lVar12 = 0;
          do {
            pjVar16[lVar12] = pjVar16[lVar12] + (pjVar25[lVar12] * -0x6583 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar6 = pjVar3 + (uint)stride;
        }
        for (; iVar21 != 0; iVar21 = iVar21 + -1) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] + ((pjVar17[lVar12] + pjVar4[lVar12]) * -0x32c1 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar6 = pjVar6 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
        }
        if (uVar19 == local_80) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] + (pjVar4[lVar12] * -0x6583 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
        }
        iVar21 = iVar15;
        pjVar6 = pjVar3;
        pjVar4 = pjVar25;
        pjVar17 = pjVar16;
        auVar28 = _DAT_0013d950;
        pjVar1 = local_78;
        if (local_80 == 0) {
          lVar12 = 0;
          do {
            lVar20 = (pjVar25 + lVar12)[1];
            uVar27 = pjVar25[uVar5 + lVar12];
            uVar30 = (pjVar25 + uVar5 + lVar12)[1];
            uVar27 = (uVar27 & 0xffffffff) * 0xfffffc9c +
                     ((uVar27 & 0xffffffff) * 0xffffffff + (uVar27 >> 0x20) * 0xfffffc9c << 0x20);
            uVar30 = (uVar30 & 0xffffffff) * 0xfffffc9c +
                     ((uVar30 & 0xffffffff) * 0xffffffff + (uVar30 >> 0x20) * 0xfffffc9c << 0x20);
            auVar28._0_4_ = (undefined4)(uVar27 >> 0xd);
            auVar28._8_4_ = (undefined4)(uVar30 >> 0xd);
            auVar28._4_4_ = auVar28._8_4_;
            auVar28._12_4_ = (int)((long)uVar30 >> 0x2d);
            pjVar25[lVar12] = CONCAT44((int)((long)uVar27 >> 0x2d),auVar28._0_4_) + pjVar25[lVar12];
            (pjVar25 + lVar12)[1] = auVar28._8_8_ + lVar20;
            lVar12 = lVar12 + 2;
          } while (lVar12 != 0x10);
          pjVar4 = pjVar25 + (uint)stride;
          auVar28 = _DAT_0013d950;
        }
        for (; auVar2 = _DAT_0013d950, _DAT_0013d950 = auVar28, iVar21 != 0; iVar21 = iVar21 + -1) {
          lVar12 = 0;
          do {
            pjVar4[lVar12] = pjVar4[lVar12] + ((pjVar1[lVar12] + pjVar17[lVar12]) * -0x1b2 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar6 = pjVar17 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
          auVar28 = _DAT_0013d950;
          pjVar1 = pjVar1 + (uint)stride;
          _DAT_0013d950 = auVar2;
        }
        if (uVar19 != local_80) {
          lVar12 = 0;
          do {
            pjVar4[lVar12] = pjVar4[lVar12] + (pjVar6[lVar12] * -0x364 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
        }
        iVar21 = iVar24;
        pjVar6 = pjVar3;
        pjVar4 = pjVar25;
        pjVar17 = local_90;
        if (local_80 != 0) {
          lVar12 = 0;
          do {
            pjVar16[lVar12] = pjVar16[lVar12] + (pjVar25[lVar12] * 0x3881 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar6 = pjVar3 + (uint)stride;
        }
        for (; iVar21 != 0; iVar21 = iVar21 + -1) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] + ((pjVar17[lVar12] + pjVar4[lVar12]) * 0x1c40 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar6 = pjVar6 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
        }
        if (uVar19 == local_80) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] + (pjVar4[lVar12] * 0x3881 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
        }
        iVar21 = iVar15;
        pjVar6 = pjVar25;
        pjVar4 = pjVar16;
        pjVar17 = local_78;
        if (local_80 == 0) {
          lVar12 = 0;
          do {
            lVar20 = (pjVar25 + lVar12)[1];
            uVar27 = pjVar25[uVar5 + lVar12];
            uVar30 = (pjVar25 + uVar5 + lVar12)[1];
            uVar27 = ((uVar27 >> 0x20) * (ulong)auVar2._0_4_ << 0x20) +
                     (uVar27 & 0xffffffff) * (ulong)auVar2._0_4_;
            uVar30 = ((uVar30 >> 0x20) * (ulong)auVar2._8_4_ << 0x20) +
                     (uVar30 & 0xffffffff) * (ulong)auVar2._8_4_;
            auVar29._0_4_ = (undefined4)(uVar27 >> 0xd);
            auVar29._8_4_ = (undefined4)(uVar30 >> 0xd);
            auVar29._4_4_ = auVar29._8_4_;
            auVar29._12_4_ = (int)((long)uVar30 >> 0x2d);
            pjVar25[lVar12] = CONCAT44((int)((long)uVar27 >> 0x2d),auVar29._0_4_) + pjVar25[lVar12];
            (pjVar25 + lVar12)[1] = auVar29._8_8_ + lVar20;
            lVar12 = lVar12 + 2;
          } while (lVar12 != 0x10);
          pjVar6 = pjVar25 + (uint)stride;
        }
        for (; iVar21 != 0; iVar21 = iVar21 + -1) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] + ((pjVar17[lVar12] + pjVar4[lVar12]) * 0xe31 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar3 = pjVar4 + (uint)stride;
          pjVar6 = pjVar6 + (uint)stride;
          pjVar4 = pjVar3;
          pjVar17 = pjVar17 + (uint)stride;
        }
        if (uVar19 != local_80) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] + (pjVar3[lVar12] * 0x1c62 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
        }
        pjVar4 = pjVar25;
        uVar11 = uVar14;
        iVar21 = iVar10;
        pjVar6 = pjVar16;
        if (1 < uVar9) {
          do {
            lVar12 = 0;
            do {
              pjVar4[lVar12] = pjVar4[lVar12] * 0x1a03 >> 0xd;
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 != 0x10);
            uVar11 = uVar11 - 1;
            pjVar4 = pjVar4 + (uint)stride;
          } while (uVar11 != 0);
        }
        for (; iVar21 != 0; iVar21 = iVar21 + -1) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] * 0x13ae >> 0xd;
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar6 = pjVar6 + (uint)stride;
        }
      }
      pjVar25 = pjVar25 + 0x10;
      uVar23 = uVar23 + 0x10;
      pjVar16 = pjVar16 + 0x10;
      local_90 = local_90 + 0x10;
      local_78 = local_78 + 0x10;
    } while (uVar23 < uVar8);
  }
  if (uVar8 != width) {
    uVar8 = width & 0xf;
    jpc_qmfb_split_colres(pjVar25,height,uVar8,stride,ystart & 1);
    if (1 < (uint)height) {
      uVar23 = (local_80 ^ 1) + height;
      uVar9 = uVar23 >> 1;
      uVar5 = (ulong)(uVar9 * stride);
      pjVar6 = pjVar25 + uVar5;
      pjVar16 = pjVar6;
      if (local_80 != 0) {
        if (uVar8 != 0) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] + (pjVar25[lVar12] * -0x6583 >> 0xd);
            lVar12 = lVar12 + 1;
          } while (uVar8 != (uint)lVar12);
        }
        pjVar16 = pjVar6 + (uint)stride;
      }
      iVar10 = height - uVar9;
      uVar14 = height & 1;
      iVar15 = (iVar10 - local_80) - (uint)(uVar14 == local_80);
      pjVar4 = pjVar25;
      if (iVar15 != 0) {
        iVar24 = iVar15;
        pjVar17 = pjVar25;
        do {
          pjVar17 = pjVar17 + (uint)stride;
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar16[lVar12] =
                   pjVar16[lVar12] + ((pjVar17[lVar12] + pjVar4[lVar12]) * -0x32c1 >> 0xd);
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
      }
      if (uVar8 != 0 && uVar14 == local_80) {
        lVar12 = 0;
        do {
          pjVar16[lVar12] = pjVar16[lVar12] + (pjVar4[lVar12] * -0x6583 >> 0xd);
          lVar12 = lVar12 + 1;
        } while (uVar8 != (uint)lVar12);
      }
      pjVar16 = pjVar25;
      if (local_80 == 0) {
        if (uVar8 != 0) {
          lVar12 = 0;
          do {
            pjVar25[lVar12] = pjVar25[lVar12] + (pjVar6[lVar12] * -0x364 >> 0xd);
            lVar12 = lVar12 + 1;
          } while (uVar8 != (uint)lVar12);
        }
        pjVar16 = pjVar25 + (uint)stride;
      }
      iVar24 = (uVar9 - (local_80 == 0)) - (uint)(uVar14 != local_80);
      pjVar4 = pjVar6;
      if (iVar24 != 0) {
        pjVar17 = pjVar25 + (uint)stride + uVar5;
        iVar21 = iVar24;
        do {
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar16[lVar12] =
                   pjVar16[lVar12] + ((pjVar17[lVar12] + pjVar4[lVar12]) * -0x1b2 >> 0xd);
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      if (uVar8 != 0 && uVar14 != local_80) {
        lVar12 = 0;
        do {
          pjVar16[lVar12] = pjVar16[lVar12] + (pjVar4[lVar12] * -0x364 >> 0xd);
          lVar12 = lVar12 + 1;
        } while (uVar8 != (uint)lVar12);
      }
      pjVar16 = pjVar6;
      if (local_80 != 0) {
        if (uVar8 != 0) {
          lVar12 = 0;
          do {
            pjVar6[lVar12] = pjVar6[lVar12] + (pjVar25[lVar12] * 0x3881 >> 0xd);
            lVar12 = lVar12 + 1;
          } while (uVar8 != (uint)lVar12);
        }
        pjVar16 = pjVar6 + (uint)stride;
      }
      pjVar4 = pjVar25;
      if (iVar15 != 0) {
        pjVar17 = pjVar25;
        do {
          pjVar17 = pjVar17 + (uint)stride;
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar16[lVar12] =
                   pjVar16[lVar12] + ((pjVar17[lVar12] + pjVar4[lVar12]) * 0x1c40 >> 0xd);
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      if (uVar8 != 0 && uVar14 == local_80) {
        lVar12 = 0;
        do {
          pjVar16[lVar12] = pjVar16[lVar12] + (pjVar4[lVar12] * 0x3881 >> 0xd);
          lVar12 = lVar12 + 1;
        } while (uVar8 != (uint)lVar12);
      }
      pjVar16 = pjVar25;
      if (local_80 == 0) {
        if (uVar8 != 0) {
          lVar12 = 0;
          do {
            pjVar25[lVar12] = pjVar25[lVar12] + (pjVar6[lVar12] * 0x1c62 >> 0xd);
            lVar12 = lVar12 + 1;
          } while (uVar8 != (uint)lVar12);
        }
        pjVar16 = pjVar25 + (uint)stride;
      }
      pjVar4 = pjVar6;
      if (iVar24 != 0) {
        pjVar17 = pjVar25 + (uint)stride + uVar5;
        do {
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar16[lVar12] =
                   pjVar16[lVar12] + ((pjVar17[lVar12] + pjVar4[lVar12]) * 0xe31 >> 0xd);
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar4 = pjVar4 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
      }
      if (uVar8 != 0 && uVar14 != local_80) {
        lVar12 = 0;
        do {
          pjVar16[lVar12] = pjVar16[lVar12] + (pjVar4[lVar12] * 0x1c62 >> 0xd);
          lVar12 = lVar12 + 1;
        } while (uVar8 != (uint)lVar12);
      }
      if (1 < uVar23) {
        do {
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar25[lVar12] = pjVar25[lVar12] * 0x1a03 >> 0xd;
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar25 = pjVar25 + (uint)stride;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      if (iVar10 != 0) {
        do {
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar6[lVar12] = pjVar6[lVar12] * 0x13ae >> 0xd;
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar6 = pjVar6 + (uint)stride;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
    }
  }
  if (height != 0) {
    uVar14 = xstart & 1;
    uVar23 = (uVar14 ^ 1) + width;
    uVar22 = uVar23 >> 1;
    uVar5 = (ulong)uVar22;
    uVar26 = (width - uVar22) - uVar14;
    uVar19 = width & 1;
    uVar8 = (uint)(uVar19 == uVar14);
    uVar9 = uVar22 - (uVar14 == 0);
    uVar11 = (uint)(uVar19 != uVar14);
    iVar15 = (uVar11 - uVar22) + (uint)(uVar14 == 0);
    pjVar25 = a + uVar5;
    iVar10 = 0;
    do {
      jpc_qmfb_split_row(a,width,uVar14);
      if (1 < (uint)width) {
        plVar7 = a + uVar5;
        plVar13 = plVar7;
        if (uVar14 != 0) {
          *plVar7 = *plVar7 + (*a * -0x6583 >> 0xd);
          plVar13 = plVar7 + 1;
        }
        plVar18 = a;
        if (uVar26 != uVar8) {
          lVar20 = 0;
          lVar12 = 0;
          do {
            plVar13[lVar12] = plVar13[lVar12] + ((a[lVar12 + 1] + a[lVar12]) * -0x32c1 >> 0xd);
            lVar12 = lVar12 + 1;
            lVar20 = lVar20 + -8;
          } while (uVar26 - uVar8 != (int)lVar12);
          plVar13 = (long *)((long)plVar13 - lVar20);
          plVar18 = (long *)((long)a - lVar20);
        }
        if (uVar19 == uVar14) {
          *plVar13 = *plVar13 + (*plVar18 * -0x6583 >> 0xd);
        }
        plVar13 = a;
        if (uVar14 == 0) {
          *a = *a + (*plVar7 * -0x364 >> 0xd);
          plVar13 = a + 1;
        }
        plVar18 = plVar7;
        if (uVar9 != uVar11) {
          lVar20 = 0;
          lVar12 = 0;
          do {
            plVar13[lVar12] =
                 plVar13[lVar12] + ((pjVar25[lVar12 + 1] + pjVar25[lVar12]) * -0x1b2 >> 0xd);
            lVar12 = lVar12 + 1;
            lVar20 = lVar20 + -8;
          } while ((int)lVar12 + iVar15 != 0);
          plVar13 = (long *)((long)plVar13 - lVar20);
          plVar18 = (long *)((long)pjVar25 - lVar20);
        }
        if (uVar19 != uVar14) {
          *plVar13 = *plVar13 + (*plVar18 * -0x364 >> 0xd);
        }
        plVar13 = plVar7;
        if (uVar14 != 0) {
          *plVar7 = *plVar7 + (*a * 0x3881 >> 0xd);
          plVar13 = plVar7 + 1;
        }
        plVar18 = a;
        if (uVar26 != uVar8) {
          lVar20 = 0;
          lVar12 = 0;
          do {
            plVar13[lVar12] = plVar13[lVar12] + ((a[lVar12 + 1] + a[lVar12]) * 0x1c40 >> 0xd);
            lVar12 = lVar12 + 1;
            lVar20 = lVar20 + -8;
          } while (uVar26 - uVar8 != (int)lVar12);
          plVar13 = (long *)((long)plVar13 - lVar20);
          plVar18 = (long *)((long)a - lVar20);
        }
        if (uVar19 == uVar14) {
          *plVar13 = *plVar13 + (*plVar18 * 0x3881 >> 0xd);
        }
        plVar13 = a;
        if (uVar14 == 0) {
          *a = *a + (*plVar7 * 0x1c62 >> 0xd);
          plVar13 = a + 1;
        }
        if (uVar9 != uVar11) {
          lVar20 = 0;
          lVar12 = 0;
          do {
            plVar13[lVar12] =
                 plVar13[lVar12] + ((pjVar25[lVar12 + 1] + pjVar25[lVar12]) * 0xe31 >> 0xd);
            lVar12 = lVar12 + 1;
            lVar20 = lVar20 + -8;
          } while ((int)lVar12 + iVar15 != 0);
          plVar13 = (long *)((long)plVar13 - lVar20);
          plVar7 = (long *)((long)pjVar25 - lVar20);
        }
        if (uVar19 != uVar14) {
          *plVar13 = *plVar13 + (*plVar7 * 0x1c62 >> 0xd);
        }
        if (1 < uVar23) {
          lVar12 = 0;
          do {
            a[lVar12] = a[lVar12] * 0x1a03 >> 0xd;
            lVar12 = lVar12 + 1;
          } while (uVar22 != (uint)lVar12);
        }
        uVar27 = uVar5;
        if (width - uVar22 != 0) {
          do {
            a[uVar27] = a[uVar27] * 0x13ae >> 0xd;
            uVar27 = uVar27 + 1;
          } while (width != (int)uVar27);
        }
      }
      a = a + stride;
      iVar10 = iVar10 + 1;
      pjVar25 = pjVar25 + stride;
    } while (iVar10 != height);
  }
  return 0;
}

Assistant:

int jpc_ns_analyze(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{

	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_qmfb_split_colgrp(startptr, numrows, stride, rowparity);
		jpc_ns_fwdlift_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_qmfb_split_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_ns_fwdlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_qmfb_split_row(startptr, numcols, colparity);
		jpc_ns_fwdlift_row(startptr, numcols, colparity);
		startptr += stride;
	}

	return 0;

}